

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O2

void __thiscall Problem_CGBG_FF::AssignAgentTypesToHouses(Problem_CGBG_FF *this)

{
  pointer puVar1;
  pointer puVar2;
  undefined1 auVar3 [16];
  vector<Scope,_std::allocator<Scope>_> *this_00;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  reference pvVar9;
  ulong uVar10;
  size_t new_nr;
  uint agI;
  ulong __n;
  ulong __n_00;
  undefined1 auVar11 [64];
  undefined1 in_XMM2 [16];
  Index hI;
  uint local_54;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_50;
  double local_48;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_40;
  vector<Scope,_std::allocator<Scope>_> *local_38;
  undefined1 extraout_var_00 [56];
  
  poVar5 = std::operator<<((ostream *)&std::cout,
                           ">>Assigning observation houses to agents --- only allowing \'action houses\' <<"
                          );
  std::endl<char,std::char_traits<char>>(poVar5);
  local_40 = &this->_m_houseIndices_action;
  local_50 = &this->_m_houseIndices_obs;
  local_38 = &this->_m_agentsForHouse_obs;
  agI = 0;
  while( true ) {
    __n = (ulong)agI;
    iVar4 = (*(this->super_BayesianGameCollaborativeGraphical).
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])(this);
    if (CONCAT44(extraout_var,iVar4) <= __n) break;
    pvVar6 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(local_40,__n);
    __n_00 = 0;
    while( true ) {
      puVar1 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      iVar4 = (int)__n_00;
      puVar2 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pvVar7 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::at(local_50,__n);
      uVar10 = (long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 2;
      if ((ulong)((long)puVar1 - (long)puVar2 >> 2) <= __n_00) break;
      if (uVar10 == this->_m_nrObservedHousesPerAgents) {
        iVar4 = (int)((ulong)((long)(pvVar6->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar6->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
      }
      else {
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(pvVar6,__n_00);
        this_00 = local_38;
        local_54 = *pvVar8;
        pvVar9 = std::vector<Scope,_std::allocator<Scope>_>::at(local_38,(ulong)local_54);
        if ((ulong)((long)(pvVar9->super_SDT).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pvVar9->super_SDT).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <
            this->_m_maxNrAgentsObservingAHouse) {
          pvVar9 = std::vector<Scope,_std::allocator<Scope>_>::at(this_00,(ulong)local_54);
          Scope::Insert(pvVar9,agI);
          pvVar7 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::at(local_50,__n);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar7,&local_54);
          poVar5 = std::operator<<((ostream *)&std::cout,"Assigning house ");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          poVar5 = std::operator<<(poVar5," to agent ");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cout,"House  ");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<(poVar5,
                          " is at full \'capacity\' (it has k agents in its scope), removing it from further consideration\n"
                         );
        }
      }
      __n_00 = (ulong)(iVar4 + 1);
    }
    if (uVar10 < this->_m_nrObservedHousesPerAgents) {
      auVar3 = vcvtusi2sd_avx512f(in_XMM2,this->_m_nrObsPerHouse);
      local_48 = auVar3._0_8_;
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::at(local_50,__n);
      auVar3 = vcvtusi2sd_avx512f(in_XMM2,(long)(pvVar6->
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pvVar6->
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                )._M_impl.super__Vector_impl_data._M_start >> 2);
      auVar11._0_8_ = pow(local_48,auVar3._0_8_);
      auVar11._8_56_ = extraout_var_00;
      new_nr = vcvttsd2usi_avx512f(auVar11._0_16_);
      BayesianGameBase::ChangeNrTypes((BayesianGameBase *)this,agI,new_nr);
    }
    agI = agI + 1;
  }
  return;
}

Assistant:

void Problem_CGBG_FF::AssignAgentTypesToHouses()
{
#define TYPES_INDEP_OF_ACTIONS 0 
#if TYPES_INDEP_OF_ACTIONS     
#if DEBUGASSIGN
    cout << ">>Assigning observation houses to agents --- independent of actions <<"<<endl;
#endif
    set<Index> availableHouses;
    for(Index hI=0; hI < _m_nrHouses; hI++)
        availableHouses.insert(hI);

    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        FixedCapacityPriorityQueue< diPair, diPairComp > pq( _m_nrObservedHousesPerAgents );
        for(set<Index>::iterator it=availableHouses.begin(); 
                it != availableHouses.end(); it++)            
        {
            Index hI = *it;
            double d = ComputeDistanceAgentToHouse(agI, hI);
            diPair p(d, hI);
            diPair overflown;
            pq.insert( p, overflown );
        }
        while(! pq.empty())
        {
            diPair p = pq.top();
            Index hI = p.second;
#if DEBUGASSIGN
            double d = p.first;
            cout << "Assigning house "<<hI<<" to agent " << agI <<
                " it has distance " << d << endl;
#endif
            _m_agentsForHouse_obs.at(hI).Insert(agI);
            _m_houseIndices_obs.at(agI).push_back(hI);
            if( _m_agentsForHouse_obs.at(hI).size() == _m_maxNrAgentsObservingAHouse )
            {
#if DEBUGASSIGN
                cout << "House  "<<hI<<" is at full 'capacity' (it has k agents in its scope), removing it from further consideration\n";
#endif
                availableHouses.erase(hI);
            }
            pq.pop();
        }
        //check how many observer house the agent actually got (could be less than _m_nrObservedHousesPerAgents!)
        if (_m_houseIndices_obs.at(agI).size() <  _m_nrObservedHousesPerAgents)
        {
            size_t nrTypes =  pow(_m_nrObsPerHouse, _m_houseIndices_obs.at(agI).size());
            ChangeNrTypes(agI, nrTypes);
        }
    }
#else // if not TYPES_INDEP_OF_ACTIONS     
#if DEBUGASSIGN
    cout << ">>Assigning observation houses to agents --- only allowing 'action houses' <<"<<endl;
#endif
    //set<Index> availableHouses;
    //for(Index hI=0; hI < _m_nrHouses; hI++)
        //availableHouses.insert(hI);

    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        const std::vector<Index> & houses_agI = _m_houseIndices_action.at(agI);
        for(Index i = 0; i < houses_agI.size(); i++)
        {
            if (_m_houseIndices_obs.at(agI).size() == _m_nrObservedHousesPerAgents)     
            {
                //agent has reached the maximum number of house, no point in looping to remaining houses
                i =  houses_agI.size();
                continue;
            }

            Index hI = houses_agI.at(i); //<-the candidate house index
            //assign this house if it is not at capacity yet
            if  (_m_agentsForHouse_obs.at(hI).size() < _m_maxNrAgentsObservingAHouse)   //this house is not at full capacity?
            {
                _m_agentsForHouse_obs.at(hI).Insert(agI);
                _m_houseIndices_obs.at(agI).push_back(hI);
#if DEBUGASSIGN
                cout << "Assigning house "<<hI<<" to agent " << agI << endl;
#endif            
            }
            else
#if DEBUGASSIGN
                cout << "House  "<<hI<<" is at full 'capacity' (it has k agents in its scope), removing it from further consideration\n";
#endif
            }

/*        
        FixedCapacityPriorityQueue< diPair, diPairComp > pq( _m_nrObservedHousesPerAgents );
        for(set<Index>::iterator it=availableHouses.begin(); 
                it != availableHouses.end(); it++)            
        {
            Index hI = *it;
            double d = ComputeDistanceAgentToHouse(agI, hI);
            diPair p(d, hI);
            diPair overflown;
            pq.insert( p, overflown );
        }
        while(! pq.empty())
        {
            diPair p = pq.top();
            Index hI = p.second;
#if DEBUGASSIGN
            double d = p.first;
            cout << "Assigning house "<<hI<<" to agent " << agI <<
                " it has distance " << d << endl;
#endif
            _m_agentsForHouse_obs.at(hI).Insert(agI);
            _m_houseIndices_obs.at(agI).push_back(hI);
            if( _m_agentsForHouse_obs.at(hI).size() == _m_maxNrAgentsObservingAHouse )
            {
#if DEBUGASSIGN
                cout << "House  "<<hI<<" is at full 'capacity' (it has k agents in its scope), removing it from further consideration\n";
#endif
                availableHouses.erase(hI);
            }
            pq.pop();
        }
*/        
        //check how many observed houses the agent actually got (could be less than _m_nrObservedHousesPerAgents!)
        if (_m_houseIndices_obs.at(agI).size() <  _m_nrObservedHousesPerAgents)
        {
            size_t nrTypes =  pow(_m_nrObsPerHouse, _m_houseIndices_obs.at(agI).size());
            ChangeNrTypes(agI, nrTypes);
        }
    }
#endif // ends if TYPES_INDEP_OF_ACTIONS     
}